

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_timer_fast.c
# Opt level: O0

int s_task_sleep_ticks(s_awaiter_t *__awaiter_dummy__,my_clock_t ticks)

{
  _Bool _Var1;
  long *in_FS_OFFSET;
  undefined1 local_50 [4];
  int ret;
  s_timer_t timer;
  my_clock_t current_ticks;
  my_clock_t ticks_local;
  s_awaiter_t *__awaiter_dummy___local;
  
  timer._44_4_ = ticks;
  timer.wakeup_ticks = my_clock();
  timer.rbt_node.parent = *(RBTNode **)(*in_FS_OFFSET + -0x40);
  timer.task._0_4_ = timer.wakeup_ticks + timer._44_4_;
  dump_timers(0x75);
  _Var1 = rbt_insert((RBTree *)(*in_FS_OFFSET + -0x38),(RBTNode *)local_50);
  if (_Var1) {
    dump_timers(0x7e);
    s_list_detach((s_list_t *)timer.rbt_node.parent);
    s_task_next(__awaiter_dummy__);
    dump_timers(0x83);
    if (timer.rbt_node.parent != (RBTNode *)0x0) {
      timer.rbt_node.parent = (RBTNode *)0x0;
      rbt_delete((RBTree *)(*in_FS_OFFSET + -0x38),(RBTNode *)local_50);
    }
    __awaiter_dummy___local._4_4_ = 0;
    if ((*(byte *)(*(long *)(*in_FS_OFFSET + -0x40) + 0x50) & 1) != 0) {
      __awaiter_dummy___local._4_4_ = -1;
    }
    *(undefined1 *)(*(long *)(*in_FS_OFFSET + -0x40) + 0x50) = 0;
  }
  else {
    fprintf(_stderr,"timer insert failed!\n");
    __awaiter_dummy___local._4_4_ = -1;
  }
  return __awaiter_dummy___local._4_4_;
}

Assistant:

int s_task_sleep_ticks(__async__, my_clock_t ticks) {
    my_clock_t current_ticks;
    s_timer_t timer;
    
    current_ticks = my_clock();
    
    timer.task = g_globals.current_task;
    timer.wakeup_ticks = current_ticks + ticks;

    dump_timers(__LINE__);

    if (!rbt_insert(&g_globals.timers, &timer.rbt_node)) {
#ifndef NDEBUG
        fprintf(stderr, "timer insert failed!\n");
#endif
        return -1;
    }

    dump_timers(__LINE__);

    s_list_detach(&timer.task->node);   /* no need, for safe */
    s_task_next(__await__);

    dump_timers(__LINE__);

    if (timer.task != NULL) {
        timer.task = NULL;
        rbt_delete(&g_globals.timers, &timer.rbt_node);
    }

    int ret = (g_globals.current_task->waiting_cancelled ? -1 : 0);
    g_globals.current_task->waiting_cancelled = false;
    return ret;
}